

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

bool check_interaction_settings_collision(options_i *options,string *file_options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"q","");
  iVar2 = (*options->_vptr_options_i[1])(options,(string *)local_50);
  cVar5 = '\x01';
  if ((char)iVar2 == '\0') {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"quadratic","");
    iVar3 = (*options->_vptr_options_i[1])(options,local_70);
    if ((char)iVar3 == '\0') {
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"cubic","");
      iVar3 = (*options->_vptr_options_i[1])(options,local_90);
      if ((char)iVar3 == '\0') {
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"interactions","");
        iVar3 = (*options->_vptr_options_i[1])(options,local_b0);
        cVar5 = (char)iVar3;
        bVar1 = true;
        bVar6 = true;
      }
      else {
        bVar1 = true;
        bVar6 = false;
        cVar5 = '\x01';
      }
      goto LAB_0012ca0f;
    }
  }
  bVar1 = false;
  bVar6 = false;
LAB_0012ca0f:
  if ((bVar6) && (local_b0[0] != local_a0)) {
    operator_delete(local_b0[0]);
  }
  if ((bVar1) && (local_90[0] != local_80)) {
    operator_delete(local_90[0]);
  }
  if (((char)iVar2 == '\0') && (local_70[0] != local_60)) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (cVar5 == '\0') {
    bVar6 = false;
  }
  else {
    lVar4 = std::__cxx11::string::find((char *)file_options,0x27973a,0);
    bVar6 = true;
    if (lVar4 == -1) {
      lVar4 = std::__cxx11::string::find((char *)file_options,0x279746,0);
      if (lVar4 == -1) {
        lVar4 = std::__cxx11::string::find((char *)file_options,0x27974e,0);
        bVar6 = lVar4 != -1;
      }
    }
  }
  return bVar6;
}

Assistant:

bool check_interaction_settings_collision(options_i& options, std::string file_options)
{
  bool command_line_has_interaction = options.was_supplied("q") || options.was_supplied("quadratic") ||
      options.was_supplied("cubic") || options.was_supplied("interactions");

  if (!command_line_has_interaction)
    return false;

  // we don't use -q to save pairs in all.file_options, so only 3 options checked
  bool file_options_has_interaction = file_options.find("--quadratic") != std::string::npos;
  file_options_has_interaction = file_options_has_interaction || (file_options.find("--cubic") != std::string::npos);
  file_options_has_interaction =
      file_options_has_interaction || (file_options.find("--interactions") != std::string::npos);

  return file_options_has_interaction;
}